

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O1

uint __thiscall
QFragmentMapData<QTextFragmentData>::next(QFragmentMapData<QTextFragmentData> *this,uint n)

{
  Header *pHVar1;
  uint uVar2;
  long lVar3;
  uint *puVar4;
  bool bVar5;
  
  pHVar1 = (this->field_0).head;
  lVar3 = (ulong)n * 0x20;
  if (*(int *)((long)pHVar1 + lVar3 + 8) == 0) {
    do {
      uVar2 = *(uint *)((long)&pHVar1->root + lVar3);
      if (*(int *)((long)pHVar1 + (ulong)n * 0x20) == 0) {
        return uVar2;
      }
      lVar3 = (ulong)uVar2 * 0x20;
      bVar5 = n == *(uint *)((long)pHVar1 + lVar3 + 8);
      n = uVar2;
    } while (bVar5);
  }
  else {
    puVar4 = (uint *)((long)pHVar1 + lVar3 + 8);
    do {
      uVar2 = *puVar4;
      puVar4 = (uint *)((long)pHVar1 + (ulong)uVar2 * 0x20 + 4);
    } while (*puVar4 != 0);
  }
  return uVar2;
}

Assistant:

inline const Fragment &F(uint index) const { return fragments[index] ; }